

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall testing::internal::WideStringToUtf8(internal *this,wchar_t *str,int num_chars)

{
  wchar_t code_point;
  undefined8 uVar1;
  size_t sVar2;
  size_t extraout_RDX;
  long lVar3;
  bool bVar4;
  String SVar5;
  stringstream local_1e0 [8];
  stringstream stream;
  ostream local_1d0 [112];
  ios_base local_160 [264];
  char local_58 [8];
  char buffer [32];
  
  buffer._24_8_ = this;
  if (num_chars == -1) {
    sVar2 = wcslen(str);
    num_chars = (int)sVar2;
  }
  std::__cxx11::stringstream::stringstream(local_1e0);
  if (0 < num_chars) {
    lVar3 = 0;
    while (code_point = str[lVar3], code_point != L'\0') {
      CodePointToUtf8(code_point,local_58);
      sVar2 = strlen(local_58);
      std::__ostream_insert<char,std::char_traits<char>>(local_1d0,local_58,sVar2);
      if ((code_point == L'\0') ||
         (bVar4 = (ulong)(uint)num_chars - 1 == lVar3, lVar3 = lVar3 + 1, bVar4)) break;
    }
  }
  uVar1 = buffer._24_8_;
  StringStreamToString((internal *)buffer._24_8_,(stringstream *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1e0);
  std::ios_base::~ios_base(local_160);
  SVar5.length_ = extraout_RDX;
  SVar5.c_str_ = (char *)uVar1;
  return SVar5;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}